

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laplace_pyramid.h
# Opt level: O2

void gimage::createLaplacianPyramid<unsigned_short>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  long lVar1;
  int iVar2;
  pointer pIVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long k;
  ulong k_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long i;
  long lVar12;
  long lVar13;
  float *pfVar14;
  float fVar15;
  __type _Var16;
  double dVar17;
  
  lVar8 = image->width;
  if (image->height < image->width) {
    lVar8 = image->height;
  }
  iVar7 = 0;
  if (1 < (int)lVar8) {
    _Var16 = std::log<int>((int)lVar8);
    dVar17 = floor(_Var16 / 0.6931471805599453);
    iVar7 = (int)dVar17;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(p,(long)iVar7);
  if (iVar7 != 0) {
    Image<float,_gimage::PixelTraits<float>_>::setImage<unsigned_short>
              ((p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,image);
    iVar2 = 1;
    if (1 < iVar7) {
      iVar2 = iVar7;
    }
    uVar10 = 0;
    while (uVar9 = uVar10, uVar9 != iVar2 - 1) {
      pIVar3 = (p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = uVar9 + 1;
      reduceGauss<float,float>(pIVar3 + uVar9 + 1,pIVar3 + uVar9);
      pIVar3 = (p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = pIVar3[uVar9].width;
      lVar1 = pIVar3[uVar9].height;
      lVar4 = lVar1 + -2;
      lVar6 = 0;
      if (0 < lVar4) {
        lVar6 = lVar4;
      }
      lVar5 = 0;
      if (0 < lVar8) {
        lVar5 = lVar8;
      }
      for (lVar11 = 0; lVar11 < pIVar3[uVar9].depth; lVar11 = lVar11 + 1) {
        pfVar14 = *pIVar3[uVar9].img[lVar11];
        for (k_00 = 0; (iVar7 = (int)lVar11, k_00 < 2 && ((long)k_00 < lVar1)); k_00 = k_00 + 1) {
          for (lVar12 = 0; lVar5 != lVar12; lVar12 = lVar12 + 1) {
            fVar15 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,lVar12,k_00,
                                iVar7);
            *pfVar14 = *pfVar14 - fVar15;
            pfVar14 = pfVar14 + 1;
          }
        }
        for (lVar12 = 2; lVar13 = lVar6, lVar12 < lVar4; lVar12 = lVar12 + 1) {
          if (0 < lVar8) {
            fVar15 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,0,lVar12,iVar7);
            *pfVar14 = *pfVar14 - fVar15;
            if (lVar8 == 1) {
              pfVar14 = pfVar14 + 1;
            }
            else {
              fVar15 = expandGaussPixel<float>
                                 ((p->
                                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10,1,lVar12,iVar7
                                 );
              pfVar14[1] = pfVar14[1] - fVar15;
              pfVar14 = pfVar14 + 2;
            }
          }
          for (lVar13 = 2; lVar13 < lVar8 + -2; lVar13 = lVar13 + 1) {
            fVar15 = expandGaussPixelInner<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,lVar13,lVar12,
                                iVar7);
            *pfVar14 = *pfVar14 - fVar15;
            pfVar14 = pfVar14 + 1;
          }
          if (2 < lVar8) {
            fVar15 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,lVar8 + -2,
                                lVar12,iVar7);
            *pfVar14 = *pfVar14 - fVar15;
            if (lVar8 == 3) {
              pfVar14 = pfVar14 + 1;
            }
            else {
              fVar15 = expandGaussPixel<float>
                                 ((p->
                                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10,lVar8 + -1,
                                  lVar12,iVar7);
              pfVar14[1] = pfVar14[1] - fVar15;
              pfVar14 = pfVar14 + 2;
            }
          }
        }
        for (; lVar13 < lVar1; lVar13 = lVar13 + 1) {
          for (lVar12 = 0; lVar5 != lVar12; lVar12 = lVar12 + 1) {
            fVar15 = expandGaussPixel<float>
                               ((p->
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar10,lVar12,lVar13,
                                iVar7);
            *pfVar14 = *pfVar14 - fVar15;
            pfVar14 = pfVar14 + 1;
          }
        }
        pIVar3 = (p->
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  return;
}

Assistant:

void createLaplacianPyramid(std::vector<ImageFloat> &p,
  const Image<T> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image

  p[0].setImage(image);

  // for all other levels

  for (int l=0; l<n-1; l++)
  {
    // compute downscaled Gaussian image for next level

    reduceGauss(p[l+1], p[l]);

    // compute Laplacian as difference of Gaussian

    const long w=p[l].getWidth();
    const long h=p[l].getHeight();

    // for all color channels

    for (int d=0; d<p[l].getDepth(); d++)
    {
      float *px=p[l].getPtr(0, 0, d);
      for (long k=0; k<2 && k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }

      for (long k=2; k<h-2; k++)
      {
        if (w > 0) *px++-=expandGaussPixel(p[l+1], 0, k, d);
        if (w > 1) *px++-=expandGaussPixel(p[l+1], 1, k, d);

        for (long i=2; i<w-2; i++)
        {
          *px++-=expandGaussPixelInner(p[l+1], i, k, d);
        }

        if (w > 2) *px++-=expandGaussPixel(p[l+1], w-2, k, d);
        if (w > 3) *px++-=expandGaussPixel(p[l+1], w-1, k, d);
      }

      for (long k=std::max(0l, h-2); k<h; k++)
      {
        for (long i=0; i<w; i++)
        {
          *px++-=expandGaussPixel(p[l+1], i, k, d);
        }
      }
    }
  }
}